

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QModelIndex * __thiscall
QListViewPrivate::closestIndex(QListViewPrivate *this,QRect *target,QList<QModelIndex> *candidates)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator o;
  QModelIndex *pQVar4;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int shortest;
  int distance;
  QRect indexRect;
  const_iterator it;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int local_d8;
  int local_d4;
  int local_8c;
  QPoint local_88;
  QPoint local_80;
  QPoint local_78;
  QPoint local_70;
  QPoint local_68;
  QPoint local_60;
  int local_58;
  QPoint local_54;
  QPoint local_4c;
  QPoint local_44;
  QPoint local_3c;
  undefined1 local_20 [16];
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8 = 0x7fffffff;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x87c9f7);
  local_10.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QModelIndex>::begin
                       ((QList<QModelIndex> *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  do {
    o = QList<QModelIndex>::end
                  ((QList<QModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    QList<QModelIndex>::const_iterator::operator*(&local_10);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0))
    ;
    if (bVar1) {
      local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QList<QModelIndex>::const_iterator::operator*(&local_10);
      indexToListViewItem((QListViewPrivate *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          (QModelIndex *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_20 = (undefined1  [16])
                 QListViewItem::rect((QListViewItem *)
                                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_3c = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ));
      iVar2 = QPoint::x((QPoint *)0x87cadc);
      iVar3 = QRect::x((QRect *)0x87caed);
      if (iVar2 < iVar3) {
LAB_0087cb3b:
        local_4c = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0));
        in_stack_fffffffffffffef4 = QPoint::x((QPoint *)0x87cb5d);
        iVar2 = QRect::x((QRect *)0x87cb6b);
        bVar1 = false;
        if (iVar2 <= in_stack_fffffffffffffef4) {
          local_54 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0));
          in_stack_fffffffffffffef0 = QPoint::x((QPoint *)0x87cb9d);
          iVar2 = QRect::right((QRect *)0x87cbab);
          bVar1 = in_stack_fffffffffffffef0 < iVar2;
        }
      }
      else {
        local_44 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0));
        iVar2 = QPoint::x((QPoint *)0x87cb16);
        iVar3 = QRect::right((QRect *)0x87cb27);
        bVar1 = true;
        if (iVar3 <= iVar2) goto LAB_0087cb3b;
      }
      if (bVar1) {
        local_60 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0));
        iVar2 = QPoint::y((QPoint *)0x87cbee);
        local_68 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0));
        local_58 = QPoint::y((QPoint *)0x87cc11);
        local_58 = iVar2 - local_58;
        local_d4 = qAbs<int>(&local_58);
      }
      else {
        local_70 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0));
        iVar2 = QPoint::y((QPoint *)0x87cc55);
        iVar3 = QRect::y((QRect *)0x87cc66);
        if (iVar2 < iVar3) {
LAB_0087ccb4:
          local_80 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0));
          in_stack_fffffffffffffed8 = QPoint::y((QPoint *)0x87ccd6);
          iVar2 = QRect::y((QRect *)0x87cce4);
          in_stack_fffffffffffffedc = in_stack_fffffffffffffedc & 0xffffff;
          if (iVar2 <= in_stack_fffffffffffffed8) {
            local_88 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                       in_stack_fffffffffffffef0));
            in_stack_fffffffffffffed4 = QPoint::y((QPoint *)0x87cd16);
            iVar2 = QRect::bottom((QRect *)0x87cd24);
            in_stack_fffffffffffffedc =
                 CONCAT13(in_stack_fffffffffffffed4 < iVar2,(int3)in_stack_fffffffffffffedc);
          }
          in_stack_fffffffffffffee4 =
               CONCAT13((char)(in_stack_fffffffffffffedc >> 0x18),(int3)in_stack_fffffffffffffee4);
        }
        else {
          local_78 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0));
          in_stack_fffffffffffffee0 = QPoint::y((QPoint *)0x87cc8f);
          iVar2 = QRect::bottom((QRect *)0x87cca0);
          in_stack_fffffffffffffee4 = CONCAT13(1,(int3)in_stack_fffffffffffffee4);
          if (iVar2 <= in_stack_fffffffffffffee0) goto LAB_0087ccb4;
        }
        if ((char)((uint)in_stack_fffffffffffffee4 >> 0x18) == '\0') {
          QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      (QPoint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          local_d4 = QPoint::manhattanLength
                               ((QPoint *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        }
        else {
          QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          in_stack_fffffffffffffed0 = QPoint::x((QPoint *)0x87cd67);
          QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          local_8c = QPoint::x((QPoint *)0x87cd8a);
          local_8c = in_stack_fffffffffffffed0 - local_8c;
          local_d4 = qAbs<int>(&local_8c);
        }
      }
      if (local_d4 < local_d8) {
        local_d8 = local_d4;
        pQVar4 = QList<QModelIndex>::const_iterator::operator*(&local_10);
        iVar2 = pQVar4->c;
        in_RDI->r = pQVar4->r;
        in_RDI->c = iVar2;
        in_RDI->i = pQVar4->i;
        (in_RDI->m).ptr = (pQVar4->m).ptr;
      }
    }
    QList<QModelIndex>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

QModelIndex QListViewPrivate::closestIndex(const QRect &target,
                                           const QList<QModelIndex> &candidates) const
{
    int distance = 0;
    int shortest = INT_MAX;
    QModelIndex closest;
    QList<QModelIndex>::const_iterator it = candidates.begin();

    for (; it != candidates.end(); ++it) {
        if (!(*it).isValid())
            continue;

        const QRect indexRect = indexToListViewItem(*it).rect();

        //if the center x (or y) position of an item is included in the rect of the other item,
        //we define the distance between them as the difference in x (or y) of their respective center.
        // Otherwise, we use the nahattan  length between the 2 items
        if ((target.center().x() >= indexRect.x() && target.center().x() < indexRect.right())
            || (indexRect.center().x() >= target.x() && indexRect.center().x() < target.right())) {
                //one item's center is at the vertical of the other
                distance = qAbs(indexRect.center().y() - target.center().y());
        } else if ((target.center().y() >= indexRect.y() && target.center().y() < indexRect.bottom())
            || (indexRect.center().y() >= target.y() && indexRect.center().y() < target.bottom())) {
                //one item's center is at the vertical of the other
                distance = qAbs(indexRect.center().x() - target.center().x());
        } else {
            distance = (indexRect.center() - target.center()).manhattanLength();
        }
        if (distance < shortest) {
            shortest = distance;
            closest = *it;
        }
    }
    return closest;
}